

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O0

ostream * cnn::operator<<(ostream *os,Tensor *t)

{
  Tensor *in_RDI;
  DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_00000228;
  ostream *in_stack_00000230;
  
  Tensor::operator*(in_RDI);
  Eigen::operator<<(in_stack_00000230,in_stack_00000228);
  return (ostream *)in_RDI;
}

Assistant:

ostream& operator<<(ostream& os, const Tensor& t) {
#if HAVE_CUDA
  vector<real> vt = as_vector(t);
  Eigen::Map<Eigen::MatrixXf> m(&vt[0], t.d.rows(), t.d.cols());
  os << m;
#else
  os << (*t);
#endif
  return os;
}